

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

void memory_tree_ns::learn_at_leaf_random
               (memory_tree *b,single_learner *base,uint32_t *leaf_id,example *ec,float *weight)

{
  node *pnVar1;
  uint *puVar2;
  example *peVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  
  b->total_num_queries = b->total_num_queries + 1;
  pnVar1 = (b->nodes)._begin;
  if (pnVar1[*leaf_id].examples_index._end != pnVar1[*leaf_id].examples_index._begin) {
    fVar5 = merand48(&b->all->random_state);
    pnVar1 = (b->nodes)._begin;
    puVar2 = pnVar1[*leaf_id].examples_index._begin;
    lVar4 = (long)(int)puVar2[(long)(fVar5 * (float)(ulong)((long)pnVar1[*leaf_id].examples_index.
                                                                  _end - (long)puVar2 >> 2)) &
                              0xffffffff];
    if (lVar4 != -1) {
      peVar3 = (b->examples)._begin[lVar4];
      if ((peVar3->l).multi.label == (ec->l).multi.label) {
        fVar5 = 1.0;
      }
      else {
        fVar5 = 0.0;
      }
      fVar6 = normalized_linear_prod(b,ec,peVar3);
      diag_kronecker_product_test(ec,(b->examples)._begin[lVar4],b->kprod_ec,b->oas);
      peVar3 = b->kprod_ec;
      (peVar3->l).simple.label = fVar5;
      (peVar3->l).simple.weight = 1.0;
      (peVar3->l).simple.initial = -fVar6;
      b->kprod_ec->weight = *weight;
      LEARNER::learner<char,_example>::learn(base,b->kprod_ec,b->max_routers);
      return;
    }
  }
  return;
}

Assistant:

void learn_at_leaf_random(memory_tree& b, single_learner& base, const uint32_t& leaf_id, example& ec, const float& weight){
        b.total_num_queries ++;
        int32_t ec_id = -1;
        float reward = 0.f;
        if (b.nodes[leaf_id].examples_index.size() > 0){
            uint32_t pos = uint32_t(merand48(b.all->random_state) * b.nodes[leaf_id].examples_index.size());
			ec_id = b.nodes[leaf_id].examples_index[pos];
        }
        if (ec_id != -1){
            if (b.examples[ec_id]->l.multi.label == ec.l.multi.label)
                reward = 1.f;             
            float score = normalized_linear_prod(b, &ec, b.examples[ec_id]);
            diag_kronecker_product_test(ec, *b.examples[ec_id], *b.kprod_ec, b.oas);
         	b.kprod_ec->l.simple = {reward, 1.f, -score};
	    	b.kprod_ec->weight = weight; //* b.nodes[leaf_id].examples_index.size();
            base.learn(*b.kprod_ec, b.max_routers);
        }
        return;
    }